

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O3

void C_ToggleConsole(void)

{
  long lVar1;
  
  if ((gamestate == GS_DEMOSCREEN) || (demoplayback)) {
    gameaction = ga_fullconsole;
    return;
  }
  if ((chatmodeon == 0) &&
     ((ConsoleState == c_up || ConsoleState == c_rising && (menuactive == MENU_Off)))) {
    ConsoleState = c_falling;
    HistPos = (History *)0x0;
    TabbedLast = 0;
    TabbedList = 0;
    return;
  }
  if ((gamestate & GS_FORCEWIPEBURN) != GS_FULLCONSOLE) {
    ConsoleState = c_rising;
    lVar1 = 0;
    do {
      *(undefined4 *)((long)&NotifyStrings[0].TimeOut + lVar1) = 0;
      lVar1 = lVar1 + 0x10;
    } while (lVar1 != 0x40);
  }
  return;
}

Assistant:

void C_ToggleConsole ()
{
	if (gamestate == GS_DEMOSCREEN || demoplayback)
	{
		gameaction = ga_fullconsole;
	}
	else if (!chatmodeon && (ConsoleState == c_up || ConsoleState == c_rising) && menuactive == MENU_Off)
	{
		ConsoleState = c_falling;
		HistPos = NULL;
		TabbedLast = false;
		TabbedList = false;
	}
	else if (gamestate != GS_FULLCONSOLE && gamestate != GS_STARTUP)
	{
		ConsoleState = c_rising;
		C_FlushDisplay ();
	}
}